

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_resetCStream_internal
                 (ZSTD_CStream *cctx,void *dict,size_t dictSize,
                 ZSTD_dictContentType_e dictContentType,ZSTD_CDict *cdict,ZSTD_CCtx_params params,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_CCtx_params params_00;
  uint uVar1;
  undefined4 in_ECX;
  void *in_RDX;
  ZSTD_CCtx *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  ZSTD_CDict *in_R9;
  undefined8 unaff_retaddr;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined8 in_stack_00000028;
  undefined8 in_stack_00000030;
  undefined8 in_stack_00000038;
  undefined8 in_stack_00000040;
  undefined8 in_stack_00000048;
  undefined8 in_stack_00000050;
  undefined8 in_stack_00000058;
  undefined8 in_stack_00000060;
  undefined8 in_stack_00000068;
  void *in_stack_00000070;
  U64 in_stack_00000078;
  ZSTD_buffered_policy_e in_stack_00000080;
  size_t errcod;
  undefined1 local_d8 [128];
  undefined4 local_58;
  undefined8 *local_50;
  undefined1 *local_48;
  size_t local_40;
  undefined4 in_stack_ffffffffffffffd8;
  size_t local_8;
  
  local_48 = local_d8;
  local_50 = &stack0x00000008;
  local_58 = 1;
  params_00.cParams._4_8_ = in_stack_00000008;
  params_00._0_8_ = unaff_retaddr;
  params_00.cParams._12_8_ = in_stack_00000010;
  params_00.cParams._20_8_ = in_stack_00000018;
  params_00.fParams._0_8_ = in_stack_00000020;
  params_00._40_8_ = in_stack_00000028;
  params_00._48_8_ = in_stack_00000030;
  params_00._56_8_ = in_stack_00000038;
  params_00._64_8_ = in_stack_00000040;
  params_00.ldmParams._4_8_ = in_stack_00000048;
  params_00.ldmParams._12_8_ = in_stack_00000050;
  params_00._88_8_ = in_stack_00000058;
  params_00.customMem.customAlloc = (ZSTD_allocFunction)in_stack_00000060;
  params_00.customMem.customFree = (ZSTD_freeFunction)in_stack_00000068;
  params_00.customMem.opaque = in_stack_00000070;
  local_40 = ZSTD_compressBegin_internal
                       (in_RSI,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                        (ZSTD_dictContentType_e)((ulong)in_R8 >> 0x20),
                        (ZSTD_dictTableLoadMethod_e)in_R8,in_R9,params_00,in_stack_00000078,
                        in_stack_00000080);
  uVar1 = ERR_isError(local_40);
  if (uVar1 == 0) {
    *(undefined8 *)(in_RDI + 0x328) = 0;
    *(undefined8 *)(in_RDI + 0x330) = 0;
    *(long *)(in_RDI + 0x338) =
         *(long *)(in_RDI + 0x118) + (long)(int)(uint)(*(ZSTD_CDict **)(in_RDI + 0x118) == in_R9);
    *(undefined8 *)(in_RDI + 0x358) = 0;
    *(undefined8 *)(in_RDI + 0x350) = 0;
    *(undefined4 *)(in_RDI + 0x360) = 1;
    *(undefined4 *)(in_RDI + 0x364) = 0;
    local_8 = 0;
  }
  else {
    local_8 = local_40;
  }
  return local_8;
}

Assistant:

static size_t ZSTD_resetCStream_internal(ZSTD_CStream* cctx,
                    const void* const dict, size_t const dictSize, ZSTD_dictContentType_e const dictContentType,
                    const ZSTD_CDict* const cdict,
                    ZSTD_CCtx_params const params, unsigned long long const pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_resetCStream_internal (disableLiteralCompression=%i)",
                params.disableLiteralCompression);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */

    CHECK_F( ZSTD_compressBegin_internal(cctx,
                                         dict, dictSize, dictContentType, ZSTD_dtlm_fast,
                                         cdict,
                                         params, pledgedSrcSize,
                                         ZSTDb_buffered) );

    cctx->inToCompress = 0;
    cctx->inBuffPos = 0;
    cctx->inBuffTarget = cctx->blockSize
                      + (cctx->blockSize == pledgedSrcSize);   /* for small input: avoid automatic flush on reaching end of block, since it would require to add a 3-bytes null block to end frame */
    cctx->outBuffContentSize = cctx->outBuffFlushedSize = 0;
    cctx->streamStage = zcss_load;
    cctx->frameEnded = 0;
    return 0;   /* ready to go */
}